

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O3

double StrToD(char *str,int flags,double empty_string_value,int *processed_characters_count,
             bool *processed_all,uc16 separator)

{
  double dVar1;
  double dVar2;
  uint length;
  size_t sVar3;
  ulong uVar4;
  int processed_characters_count16;
  uc16 buffer16 [256];
  uint local_29c;
  StringToDoubleConverter local_298;
  StringToDoubleConverter local_268;
  uc16 local_238 [260];
  
  local_298.junk_string_value_ = NAN;
  local_298.infinity_symbol_ = (char *)0x0;
  local_298.nan_symbol_ = (char *)0x0;
  local_298.flags_ = flags;
  local_298.empty_string_value_ = empty_string_value;
  local_298.separator_ = separator;
  sVar3 = strlen(str);
  dVar1 = double_conversion::StringToDoubleConverter::StringToDouble
                    (&local_298,str,(int)sVar3,processed_characters_count);
  sVar3 = strlen(str);
  *processed_all = sVar3 == (uint)*processed_characters_count;
  sVar3 = strlen(str);
  length = (uint)sVar3;
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      local_238[uVar4] = (short)str[uVar4];
      uVar4 = uVar4 + 1;
    } while ((length & 0x7fffffff) != uVar4);
  }
  local_268.junk_string_value_ = NAN;
  local_268.infinity_symbol_ = (char *)0x0;
  local_268.nan_symbol_ = (char *)0x0;
  local_268.flags_ = flags;
  local_268.empty_string_value_ = empty_string_value;
  local_268.separator_ = separator;
  dVar2 = double_conversion::StringToDoubleConverter::StringToDouble
                    (&local_268,local_238,length,(int *)&local_29c);
  if (((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) &&
     ((!NAN(dVar1) && !NAN(dVar1) || (!NAN(dVar2))))) {
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %.30e\n#  Found:    %.30e\n",
           "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
           ,0x767,"result","result16");
    abort();
  }
  if (*processed_characters_count == local_29c) {
    return dVar1;
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,0x768,"*processed_characters_count","processed_characters_count16",
         (ulong)(uint)*processed_characters_count,local_29c);
  abort();
}

Assistant:

static double StrToD(const char* str, int flags, double empty_string_value,
                     int* processed_characters_count, bool* processed_all,
                     uc16 separator = StringToDoubleConverter::kNoSeparator) {
  StringToDoubleConverter converter(flags, empty_string_value, Double::NaN(),
                                    NULL, NULL, separator);
  double result = converter.StringToDouble(str, strlen(str),
                                           processed_characters_count);
  *processed_all =
      ((strlen(str) == static_cast<unsigned>(*processed_characters_count)));

  uc16 buffer16[256];
  DOUBLE_CONVERSION_ASSERT(strlen(str) < DOUBLE_CONVERSION_ARRAY_SIZE(buffer16));
  int len = strlen(str);
  for (int i = 0; i < len; i++) {
    buffer16[i] = str[i];
  }
  int processed_characters_count16;
  bool processed_all16;
  double result16 = StrToD16(buffer16, len, flags, empty_string_value,
                             &processed_characters_count16, &processed_all16,
                             separator);
  CHECK_EQ(result, result16);
  CHECK_EQ(*processed_characters_count, processed_characters_count16);
  return result;
}